

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_add_order_mpid *m)

{
  char *pcVar1;
  order_book *this_00;
  char cVar2;
  undefined1 auVar3 [48];
  side_type sVar4;
  undefined8 uVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  _Hash_node_base *p_Var13;
  char *end;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  undefined7 uStack_7f;
  undefined1 local_70 [64];
  
  pcVar1 = m->OrderBook;
  lVar9 = 0;
  do {
    if (pcVar1[lVar9] != ' ') {
      pcVar10 = pcVar1 + lVar9;
      break;
    }
    lVar9 = lVar9 + 1;
    pcVar10 = m->Price;
  } while (lVar9 != 6);
  p_Var6 = (_Hash_node_base *)0x0;
  for (; pcVar10 != m->Price; pcVar10 = pcVar10 + 1) {
    p_Var6 = (_Hash_node_base *)(((long)*pcVar10 + (long)p_Var6 * 10) - 0x30);
  }
  uVar8 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar11 = (ulong)p_Var6 % uVar8;
  p_Var14 = (this->order_book_id_map)._M_h._M_buckets[uVar11];
  p_Var15 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var13 = p_Var14->_M_nxt, p_Var15 = p_Var14, p_Var6 != p_Var14->_M_nxt[1]._M_nxt)) {
    while (p_Var14 = p_Var13, p_Var13 = p_Var14->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
      p_Var15 = (__node_base_ptr)0x0;
      if (((ulong)p_Var13[1]._M_nxt % uVar8 != uVar11) ||
         (p_Var15 = p_Var14, p_Var6 == p_Var13[1]._M_nxt)) goto LAB_001179cc;
    }
    p_Var15 = (__node_base_ptr)0x0;
  }
LAB_001179cc:
  if (p_Var15 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var15->_M_nxt;
  }
  if (p_Var6 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)(p_Var6 + 2);
    lVar9 = 1;
    do {
      if (m->OrderReferenceNumber[lVar9 + -1] != ' ') {
        pcVar10 = m->OrderReferenceNumber + lVar9 + -1;
        break;
      }
      lVar9 = lVar9 + 1;
      pcVar10 = &m->BuySellIndicator;
    } while (lVar9 != 10);
    lVar9 = 0;
    for (; pcVar10 != &m->BuySellIndicator; pcVar10 = pcVar10 + 1) {
      lVar9 = (long)*pcVar10 + lVar9 * 10 + -0x30;
    }
    lVar12 = 0;
    do {
      if (m->Price[lVar12] != ' ') {
        pcVar10 = m->Price + lVar12;
        break;
      }
      lVar12 = lVar12 + 1;
      pcVar10 = m->Attribution;
    } while (lVar12 != 10);
    lVar12 = 0;
    for (; pcVar10 != m->Attribution; pcVar10 = pcVar10 + 1) {
      lVar12 = (long)*pcVar10 + lVar12 * 10 + -0x30;
    }
    lVar7 = 0;
    do {
      if (m->Quantity[lVar7] != ' ') {
        pcVar10 = m->Quantity + lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
      pcVar10 = pcVar1;
    } while (lVar7 != 9);
    if (pcVar10 == pcVar1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        cVar2 = *pcVar10;
        pcVar10 = pcVar10 + 1;
        uVar8 = ((long)cVar2 + uVar8 * 10) - 0x30;
      } while (pcVar10 != pcVar1);
      uVar8 = uVar8 & 0xffffffff;
    }
    sVar4 = itch_side(m->BuySellIndicator);
    auVar3._25_7_ = uStack_7f;
    auVar3[0x18] = sVar4;
    auVar3._8_8_ = lVar12;
    auVar3._0_8_ = lVar9;
    auVar3._16_8_ = uVar8;
    auVar3._32_8_ = this->time_sec * 1000 + this->time_msec;
    auVar3._40_8_ = 0;
    order_book::add(this_00,(order)(auVar3 << 0x40));
    local_70._0_8_ = lVar9;
    local_70._8_8_ = this_00;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_id_map);
    p_Var13 = (_Hash_node_base *)(this->time_sec * 1000 + this->time_msec);
    p_Var6[6]._M_nxt = p_Var13;
    make_ob_event((event *)local_70,(string *)this_00,(uint64_t)p_Var13,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      if ((order_book *)local_70._8_8_ != (order_book *)(local_70 + 0x18)) {
        operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
      }
      _Unwind_Resume(uVar5);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,(event *)local_70);
    if ((order_book *)local_70._8_8_ != (order_book *)(local_70 + 0x18)) {
      operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_add_order_mpid* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
        uint64_t price    = itch_uatoi(m->Price, sizeof(m->Price));;
        uint32_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));;
        auto     side     = itch_side(m->BuySellIndicator);

        order o{order_id, price, quantity, side, timestamp()};
        ob.add(std::move(o));

        order_id_map.insert({order_id, ob});
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}